

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,decimal_fp<double> *fp,
          basic_format_specs<char8_t> *specs,float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  byte bVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar3;
  byte *pbVar4;
  long lVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  size_t sVar11;
  uint uVar12;
  char8_t decimal_point;
  char8_t zero;
  bool pointy;
  int significand_size;
  sign_t sign;
  significand_type significand;
  int exp;
  int num_zeros;
  anon_class_40_8_dbbf3351 write;
  undefined1 local_d2 [14];
  undefined1 auStack_c4 [8];
  sign_t local_bc;
  float_specs local_b8;
  undefined1 local_ac [8];
  int iStack_a4;
  long local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  char local_88;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> local_80;
  anon_class_72_9_d68ba176 local_78;
  
  local_b8 = (float_specs)fp->significand;
  lVar5 = 0x3f;
  if (((ulong)local_b8 | 1) != 0) {
    for (; ((ulong)local_b8 | 1) >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  local_d2._6_4_ =
       (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar5] -
       (uint)((ulong)local_b8 <
             (ulong)*(float_specs *)
                     (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                     (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar5] * 8));
  local_d2[1] = 0x30;
  auStack_c4._0_4_ = fspecs._4_4_;
  local_bc = (uint)auStack_c4._0_4_ >> 8 & 0xff;
  fVar1 = fspecs;
  if ((int)local_d2._6_4_ < 0) goto LAB_00181d6d;
  uVar12 = (local_d2._6_4_ + 1) - (uint)(local_bc == none);
  uVar10 = (ulong)uVar12;
  local_d2[0] = '.';
  uVar8 = (uint)auStack_c4._0_4_ >> 0x11;
  unique0x1000050b = fspecs;
  if ((uVar8 & 1) != 0) {
    local_d2[0] = fmt::v8::detail::decimal_point_impl<char>(loc);
  }
  iVar7 = fp->exponent;
  local_ac._0_4_ = local_d2._6_4_ + iVar7;
  if (local_d2[0xe] == '\x01') {
LAB_00181ad1:
    iVar7 = local_d2._6_4_ + iVar7 + -1;
    if (((uint)auStack_c4._0_4_ >> 0x14 & 1) == 0) {
      iVar9 = 0;
      if (local_d2._6_4_ == 1) {
        local_d2[0] = '\0';
        iVar9 = 0;
      }
    }
    else {
      iVar9 = 0;
      if (0 < (int)(local_d2._10_4_ - local_d2._6_4_)) {
        iVar9 = local_d2._10_4_ - local_d2._6_4_;
      }
      uVar10 = (ulong)(uVar12 + iVar9);
    }
    local_78.sign = (sign_t *)CONCAT44(local_78.sign._4_4_,local_bc);
    local_78.significand = (significand_type *)local_b8;
    local_78.significand_size._0_5_ = CONCAT14(local_d2[0],local_d2._6_4_);
    local_78.fp._0_5_ = CONCAT14(0x30,iVar9);
    local_78.fp = (decimal_fp<double> *)
                  (CONCAT26(local_78.fp._6_2_,
                            CONCAT15((((uint)auStack_c4._0_4_ >> 0x10 & 1) == 0) << 5,
                                     local_78.fp._0_5_)) | 0x450000000000);
    local_78.grouping = (digit_grouping<char8_t> *)CONCAT44(local_78.grouping._4_4_,iVar7);
    if (specs->width < 1) {
      bVar3 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<double>,_char8_t,_fmt::v8::detail::digit_grouping<char8_t>_>
              ::anon_class_40_8_dbbf3351::operator()
                        ((anon_class_40_8_dbbf3351 *)&local_78,out.container);
    }
    else {
      if ((int)local_ac._0_4_ < 1) {
        iVar7 = 1 - local_ac._0_4_;
      }
      lVar5 = 2;
      if (99 < iVar7) {
        lVar5 = (ulong)(999 < iVar7) + 3;
      }
      sVar11 = uVar10 + lVar5 + (3 - (ulong)(local_d2[0] == '\0'));
      bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (out,specs,sVar11,sVar11,(anon_class_40_8_dbbf3351 *)&local_78);
    }
  }
  else {
    if (((ulong)stack0xffffffffffffff38 & 0xff00000000) == 0) {
      iVar9 = 0x10;
      if (0 < (int)local_d2._10_4_) {
        iVar9 = local_d2._10_4_;
      }
      if (((int)local_ac._0_4_ < -3) || (iVar9 < (int)local_ac._0_4_)) goto LAB_00181ad1;
    }
    if (iVar7 < 0) {
      if ((int)local_ac._0_4_ < 1) {
        iVar7 = -local_ac._0_4_;
        local_ac._4_4_ = iVar7;
        if (SBORROW4(local_d2._10_4_,iVar7) != (int)(local_d2._10_4_ + local_ac._0_4_) < 0) {
          local_ac._4_4_ = local_d2._10_4_;
        }
        if ((int)local_d2._10_4_ < 0) {
          local_ac._4_4_ = iVar7;
        }
        if (local_d2._6_4_ != 0) {
          local_ac._4_4_ = iVar7;
        }
        bVar2 = 1;
        if (local_d2._6_4_ == 0 && local_ac._4_4_ == 0) {
          bVar2 = (auStack_c4[2] & 0x10) >> 4;
        }
        local_d2[2] = bVar2;
        fVar1 = stack0xffffffffffffff38;
        if (-1 < (int)local_ac._4_4_) {
          sVar11 = ((uint)bVar2 + local_ac._4_4_ + 1) + uVar10;
          local_78.sign = &local_bc;
          local_78.significand = (significand_type *)(local_d2 + 1);
          local_78.significand_size = (int *)(local_d2 + 2);
          local_78.fp = (decimal_fp<double> *)local_d2;
          local_78.grouping = (digit_grouping<char8_t> *)(local_ac + 4);
          local_78.fspecs = &local_b8;
          local_78.decimal_point = local_d2 + 6;
          bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_&>
                            (out,specs,sVar11,sVar11,(anon_class_56_7_162c6e41 *)&local_78);
          return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar3.container;
        }
LAB_00181d6d:
        stack0xffffffffffffff38 = fVar1;
        fmt::v8::detail::assert_fail
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                   ,0x195,"negative value");
      }
      uVar12 = 0;
      local_d2._2_4_ = local_d2._10_4_ - local_d2._6_4_ & (int)(auStack_c4._0_4_ << 0xb) >> 0x1f;
      uVar8 = local_d2._2_4_;
      if ((int)local_d2._2_4_ < 1) {
        uVar8 = uVar12;
      }
      local_80.container = out.container;
      digit_grouping<char8_t>::digit_grouping
                ((digit_grouping<char8_t> *)(local_ac + 4),loc,
                 (bool)((byte)((uint)auStack_c4._0_4_ >> 0x11) & 1));
      pbVar4 = (byte *)CONCAT44(iStack_a4,local_ac._4_4_);
      pbVar6 = pbVar4 + local_a0;
      sVar11 = uVar8 + uVar10;
      do {
        uVar8 = 0x7fffffff;
        if (local_88 != '\0') {
          if (pbVar4 == pbVar6) {
            uVar8 = (uint)(char)pbVar6[-1];
          }
          else {
            bVar2 = *pbVar4;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_00181c3f;
            pbVar4 = pbVar4 + 1;
            uVar8 = (uint)bVar2;
          }
          uVar12 = uVar12 + uVar8;
          uVar8 = uVar12;
        }
LAB_00181c3f:
        sVar11 = sVar11 + 1;
      } while ((int)uVar8 < (int)local_d2._6_4_);
      local_78.sign = &local_bc;
      local_78.significand = (significand_type *)&local_b8;
      local_78.significand_size = (int *)(local_d2 + 6);
      local_78.fp = (decimal_fp<double> *)local_ac;
      local_78.grouping = (digit_grouping<char8_t> *)local_d2;
      local_78.decimal_point = local_d2 + 2;
      local_78.num_zeros = (int *)(local_d2 + 1);
      local_78.fspecs = (float_specs *)(local_ac + 4);
      bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_&>
                        (local_80,specs,sVar11,sVar11,(anon_class_64_8_e6ffa566 *)&local_78);
    }
    else {
      uVar10 = (ulong)(iVar7 + uVar12);
      local_d2._2_4_ = local_d2._10_4_ - local_ac._0_4_;
      if (((uint)auStack_c4._0_4_ >> 0x14 & 1) != 0) {
        if (local_d2[0xe] != '\x02' && (int)local_d2._2_4_ < 1) {
          local_d2._2_4_ = 1;
        }
        if (0 < (int)local_d2._2_4_) {
          uVar10 = uVar10 + (uint)local_d2._2_4_ + 1;
        }
      }
      digit_grouping<char8_t>::digit_grouping
                ((digit_grouping<char8_t> *)(local_ac + 4),loc,
                 (bool)((byte)((uint)auStack_c4._0_4_ >> 0x11) & 1));
      pbVar4 = (byte *)CONCAT44(iStack_a4,local_ac._4_4_);
      pbVar6 = pbVar4 + local_a0;
      sVar11 = uVar10 - 1;
      iVar7 = 0;
      do {
        iVar9 = 0x7fffffff;
        if (local_88 != '\0') {
          if (pbVar4 == pbVar6) {
            uVar8 = (uint)(char)pbVar6[-1];
          }
          else {
            bVar2 = *pbVar4;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_00181a68;
            pbVar4 = pbVar4 + 1;
            uVar8 = (uint)bVar2;
          }
          iVar7 = iVar7 + uVar8;
          iVar9 = iVar7;
        }
LAB_00181a68:
        sVar11 = sVar11 + 1;
      } while (iVar9 < (int)local_d2._6_4_);
      local_78.sign = &local_bc;
      local_78.significand = (significand_type *)&local_b8;
      local_78.significand_size = (int *)(local_d2 + 6);
      local_78.fspecs = (float_specs *)(local_d2 + 10);
      local_78.decimal_point = local_d2;
      local_78.num_zeros = (int *)(local_d2 + 2);
      local_78.zero = local_d2 + 1;
      local_78.fp = fp;
      local_78.grouping = (digit_grouping<char8_t> *)(local_ac + 4);
      bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_&>
                        (out,specs,sVar11,sVar11,&local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(iStack_a4,local_ac._4_4_) != &local_98) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(iStack_a4,local_ac._4_4_),local_98._M_allocated_capacity + 1);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}